

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::focusOutEvent(QPlainTextEdit *this,QFocusEvent *e)

{
  QWidget *in_RDI;
  QEvent *unaff_retaddr;
  QPlainTextEditPrivate *in_stack_00000008;
  QPlainTextEditPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  d_func((QPlainTextEdit *)0x6c7b41);
  QWidget::focusOutEvent(in_RDI,in_stack_ffffffffffffffd8);
  QPlainTextEditPrivate::sendControlEvent(in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void QPlainTextEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QPlainTextEdit);
    QAbstractScrollArea::focusOutEvent(e);
    d->sendControlEvent(e);
}